

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * string_from_abi_cxx11_(vector<int,_std::allocator<int>_> *values)

{
  bool bVar1;
  bool bVar2;
  const_iterator cVar3;
  reference piVar4;
  string *in_RDI;
  int e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  bool first;
  stringstream buf;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  string local_1e8 [36];
  int local_1c4;
  int *local_1c0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"[ ");
  bVar1 = true;
  cVar3 = std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffdf8);
  local_1c0 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffdf8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe00,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffdf8);
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &stack0xfffffffffffffe48);
    local_1c4 = *piVar4;
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::operator<<(local_188,", ");
    }
    in_stack_fffffffffffffe00 = local_188;
    std::__cxx11::to_string((int)((ulong)cVar3._M_current >> 0x20));
    std::operator<<(in_stack_fffffffffffffe00,local_1e8);
    std::__cxx11::string::~string(local_1e8);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xfffffffffffffe48);
  }
  std::operator<<(local_188," ]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string string_from(const std::vector<int> & values) {
    std::stringstream buf;

    buf << "[ ";
    bool first = true;
    for (auto e : values) {
        if (first) {
            first = false;
        } else {
            buf << ", ";
        }
        buf << std::to_string(e);
    }
    buf << " ]";

    return buf.str();
}